

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfiledialog.cpp
# Opt level: O1

void __thiscall
QFileDialogTreeView::setFileDialogPrivate(QFileDialogTreeView *this,QFileDialogPrivate *d_pointer)

{
  QHeaderView *pQVar1;
  
  this->d_ptr = d_pointer;
  QAbstractItemView::setSelectionBehavior((QAbstractItemView *)this,SelectRows);
  QTreeView::setRootIsDecorated(&this->super_QTreeView,false);
  QTreeView::setItemsExpandable(&this->super_QTreeView,false);
  QTreeView::setSortingEnabled(&this->super_QTreeView,true);
  pQVar1 = QTreeView::header(&this->super_QTreeView);
  QHeaderView::setSortIndicator(pQVar1,0,AscendingOrder);
  pQVar1 = QTreeView::header(&this->super_QTreeView);
  QHeaderView::setStretchLastSection(pQVar1,false);
  QAbstractItemView::setTextElideMode((QAbstractItemView *)this,ElideMiddle);
  QAbstractItemView::setEditTriggers((QAbstractItemView *)this,(EditTriggers)0x8);
  QWidget::setContextMenuPolicy((QWidget *)this,CustomContextMenu);
  QAbstractItemView::setDragDropMode((QAbstractItemView *)this,InternalMove);
  return;
}

Assistant:

void QFileDialogTreeView::setFileDialogPrivate(QFileDialogPrivate *d_pointer)
{
    d_ptr = d_pointer;
    setSelectionBehavior(QAbstractItemView::SelectRows);
    setRootIsDecorated(false);
    setItemsExpandable(false);
    setSortingEnabled(true);
    header()->setSortIndicator(0, Qt::AscendingOrder);
    header()->setStretchLastSection(false);
    setTextElideMode(Qt::ElideMiddle);
    setEditTriggers(QAbstractItemView::EditKeyPressed);
    setContextMenuPolicy(Qt::CustomContextMenu);
#if QT_CONFIG(draganddrop)
    setDragDropMode(QAbstractItemView::InternalMove);
#endif
}